

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nodeRelease(Rtree *pRtree,RtreeNode *pNode)

{
  int local_1c;
  int rc;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  local_1c = 0;
  if ((pNode != (RtreeNode *)0x0) && (pNode->nRef = pNode->nRef + -1, pNode->nRef == 0)) {
    pRtree->nNodeRef = pRtree->nNodeRef - 1;
    if (pNode->iNode == 1) {
      pRtree->iDepth = -1;
    }
    if (pNode->pParent != (RtreeNode *)0x0) {
      local_1c = nodeRelease(pRtree,pNode->pParent);
    }
    if (local_1c == 0) {
      local_1c = nodeWrite(pRtree,pNode);
    }
    nodeHashDelete(pRtree,pNode);
    sqlite3_free(pNode);
  }
  return local_1c;
}

Assistant:

static int nodeRelease(Rtree *pRtree, RtreeNode *pNode){
  int rc = SQLITE_OK;
  if( pNode ){
    assert( pNode->nRef>0 );
    assert( pRtree->nNodeRef>0 );
    pNode->nRef--;
    if( pNode->nRef==0 ){
      pRtree->nNodeRef--;
      if( pNode->iNode==1 ){
        pRtree->iDepth = -1;
      }
      if( pNode->pParent ){
        rc = nodeRelease(pRtree, pNode->pParent);
      }
      if( rc==SQLITE_OK ){
        rc = nodeWrite(pRtree, pNode);
      }
      nodeHashDelete(pRtree, pNode);
      sqlite3_free(pNode);
    }
  }
  return rc;
}